

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

void __thiscall
cmQtAutoGenInitializer::AddAutogenExecutableToDependencies
          (cmQtAutoGenInitializer *this,GenVarsT *genVars,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dependencies)

{
  bool bVar1;
  string *__x;
  size_t sVar2;
  char *pcVar3;
  _Hash_node_base *p_Var4;
  char *pcVar5;
  bool bVar6;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string executableWithConfig;
  string local_c8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_a8;
  _Hash_node_base *local_90;
  _Hash_node_base *local_88;
  undefined8 local_80;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  _Hash_node_base *local_60;
  _Hash_node_base *local_58;
  undefined8 local_50;
  long local_48;
  char *local_40;
  undefined8 local_38;
  
  if (genVars->ExecutableTarget != (cmGeneratorTarget *)0x0) {
    __x = cmTarget::GetName_abi_cxx11_(genVars->ExecutableTarget->Target);
LAB_004fd42a:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(dependencies,__x);
    return;
  }
  if ((this->MultiConfig == true) && (this->UseBetterGraph == true)) {
    bVar1 = this->CrossConfig;
    bVar6 = (ulong)bVar1 != 0;
    sVar2 = 0xb;
    if (bVar6) {
      sVar2 = 0x1c;
    }
    pcVar3 = "$<$<CONFIG:";
    if (bVar6) {
      pcVar3 = "$<COMMAND_CONFIG:$<$<CONFIG:";
    }
    pcVar5 = ">";
    if (bVar6) {
      pcVar5 = ">>";
    }
    p_Var4 = (genVars->Executable).Config._M_h._M_before_begin._M_nxt;
    if (p_Var4 != (_Hash_node_base *)0x0) {
      do {
        local_a8.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_88 = p_Var4[1]._M_nxt;
        local_90 = p_Var4[2]._M_nxt;
        local_80 = 0;
        local_78 = 2;
        local_70 = ">:";
        local_68 = 0;
        local_58 = p_Var4[5]._M_nxt;
        local_60 = p_Var4[6]._M_nxt;
        local_50 = 0;
        local_38 = 0;
        views._M_len = 5;
        views._M_array = &local_a8;
        local_a8.first._M_len = sVar2;
        local_a8.first._M_str = pcVar3;
        local_48 = (ulong)bVar1 + 1;
        local_40 = pcVar5;
        cmCatViews(&local_c8,views);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)dependencies
                   ,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        p_Var4 = p_Var4->_M_nxt;
      } while (p_Var4 != (_Hash_node_base *)0x0);
    }
  }
  else if ((genVars->Executable).Default._M_string_length != 0) {
    __x = &(genVars->Executable).Default;
    goto LAB_004fd42a;
  }
  return;
}

Assistant:

void cmQtAutoGenInitializer::AddAutogenExecutableToDependencies(
  cmQtAutoGenInitializer::GenVarsT const& genVars,
  std::vector<std::string>& dependencies) const
{
  if (genVars.ExecutableTarget != nullptr) {
    dependencies.push_back(genVars.ExecutableTarget->Target->GetName());
  } else if (this->MultiConfig && this->UseBetterGraph) {
    cm::string_view const& configGenexWithCommandConfig =
      "$<COMMAND_CONFIG:$<$<CONFIG:";
    cm::string_view const& configGenex = "$<$<CONFIG:";
    cm::string_view const& configGenexEnd = ">";
    cm::string_view const& configGenexEndWithCommandConfig = ">>";
    auto genexBegin =
      this->CrossConfig ? configGenexWithCommandConfig : configGenex;
    auto genexEnd =
      this->CrossConfig ? configGenexEndWithCommandConfig : configGenexEnd;
    for (auto const& config : genVars.Executable.Config) {
      auto executableWithConfig =
        cmStrCat(genexBegin, config.first, ">:", config.second, genexEnd);
      dependencies.emplace_back(std::move(executableWithConfig));
    }
  } else {
    if (!genVars.Executable.Default.empty()) {
      dependencies.push_back(genVars.Executable.Default);
    }
  }
}